

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int FnNoise1_short(short *array,long nx,long ny,int nullcheck,short nullvalue,double *noise,
                  int *status)

{
  int *status_00;
  double *array_00;
  double *sigma;
  int in_ECX;
  size_t in_RDX;
  size_t in_RSI;
  long in_RDI;
  short in_R8W;
  double *in_R9;
  bool bVar1;
  int *in_stack_00000008;
  double stdev;
  double mean;
  double xnoise;
  double *diffs;
  short v1;
  short *rowpix;
  short *differences;
  long nvals;
  long nrows;
  long kk;
  long jj;
  long ii;
  int iter;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  long *in_stack_ffffffffffffff68;
  undefined2 local_90;
  short in_stack_ffffffffffffff72;
  int in_stack_ffffffffffffff74;
  long in_stack_ffffffffffffff78;
  double dVar2;
  short local_72;
  long local_60;
  size_t local_58;
  long local_50;
  long local_48;
  size_t local_40;
  int local_34;
  int local_4;
  
  local_58 = 0;
  if ((long)in_RSI < 3) {
    *in_R9 = 0.0;
    local_4 = *in_stack_00000008;
  }
  else {
    status_00 = (int *)calloc(in_RSI,2);
    if (status_00 == (int *)0x0) {
      *in_stack_00000008 = 0x71;
      local_4 = *in_stack_00000008;
    }
    else {
      array_00 = (double *)calloc(in_RDX,8);
      if (array_00 == (double *)0x0) {
        free(status_00);
        *in_stack_00000008 = 0x71;
        local_4 = *in_stack_00000008;
      }
      else {
        for (local_48 = 0; local_48 < (long)in_RDX; local_48 = local_48 + 1) {
          sigma = (double *)(in_RDI + local_48 * in_RSI * 2);
          local_40 = 0;
          if (in_ECX != 0) {
            while( true ) {
              bVar1 = false;
              if ((long)local_40 < (long)in_RSI) {
                bVar1 = *(short *)((long)sigma + local_40 * 2) == in_R8W;
              }
              if (!bVar1) break;
              local_40 = local_40 + 1;
            }
            in_stack_ffffffffffffff67 = 0;
          }
          if (local_40 != in_RSI) {
            local_72 = *(short *)((long)sigma + local_40 * 2);
            local_60 = 0;
            while (local_40 = local_40 + 1, (long)local_40 < (long)in_RSI) {
              if (in_ECX != 0) {
                while( true ) {
                  bVar1 = false;
                  if ((long)local_40 < (long)in_RSI) {
                    bVar1 = *(short *)((long)sigma + local_40 * 2) == in_R8W;
                  }
                  if (!bVar1) break;
                  local_40 = local_40 + 1;
                }
                in_stack_ffffffffffffff66 = 0;
              }
              if (local_40 == in_RSI) break;
              *(short *)((long)status_00 + local_60 * 2) =
                   local_72 - *(short *)((long)sigma + local_40 * 2);
              local_60 = local_60 + 1;
              local_72 = *(short *)((long)sigma + local_40 * 2);
            }
            if (1 < local_60) {
              FnMeanSigma_short((short *)array_00,in_stack_ffffffffffffff78,
                                in_stack_ffffffffffffff74,in_stack_ffffffffffffff72,
                                in_stack_ffffffffffffff68,
                                (double *)
                                CONCAT17(in_stack_ffffffffffffff67,
                                         CONCAT16(in_stack_ffffffffffffff66,
                                                  in_stack_ffffffffffffff60)),sigma,status_00);
              if (0.0 < (double)in_stack_ffffffffffffff68) {
                for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
                  local_50 = 0;
                  for (local_40 = 0; (long)local_40 < local_60; local_40 = local_40 + 1) {
                    if (ABS((double)(int)*(short *)((long)status_00 + local_40 * 2) -
                            (double)CONCAT44(in_stack_ffffffffffffff74,
                                             CONCAT22(in_stack_ffffffffffffff72,local_90))) <
                        (double)in_stack_ffffffffffffff68 * 5.0) {
                      if (local_50 < (long)local_40) {
                        *(undefined2 *)((long)status_00 + local_50 * 2) =
                             *(undefined2 *)((long)status_00 + local_40 * 2);
                      }
                      local_50 = local_50 + 1;
                    }
                  }
                  if (local_50 == local_60) break;
                  local_60 = local_50;
                  FnMeanSigma_short((short *)array_00,in_stack_ffffffffffffff78,
                                    in_stack_ffffffffffffff74,in_stack_ffffffffffffff72,
                                    in_stack_ffffffffffffff68,
                                    (double *)
                                    CONCAT17(in_stack_ffffffffffffff67,
                                             CONCAT16(in_stack_ffffffffffffff66,
                                                      in_stack_ffffffffffffff60)),sigma,status_00);
                }
              }
              array_00[local_58] = (double)in_stack_ffffffffffffff68;
              local_58 = local_58 + 1;
            }
          }
        }
        if (local_58 == 0) {
          dVar2 = 0.0;
        }
        else if (local_58 == 1) {
          dVar2 = *array_00;
        }
        else {
          qsort(array_00,local_58,8,FnCompare_double);
          dVar2 = (array_00[(long)(local_58 - 1) / 2] + array_00[(long)local_58 / 2]) / 2.0;
        }
        *in_R9 = dVar2 * 0.70710678;
        free(array_00);
        free(status_00);
        local_4 = *in_stack_00000008;
      }
    }
  }
  return local_4;
}

Assistant:

static int FnNoise1_short
       (short *array,       /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
        long ny,            /* number of rows in the image */
	int nullcheck,      /* check for null values, if true */
	short nullvalue,    /* value of null pixels, if nullcheck is true */
   /* returned parameters */   
	double *noise,      /* returned R.M.S. value of all non-null pixels */
	int *status)        /* error status */
/*
Estimate the background noise in the input image using sigma of 1st order differences.

  noise = 1.0 / sqrt(2) * rms of (flux[i] - flux[i-1])

The returned estimate is the median of the values that are computed for each 
row of the image.
*/
{
	int iter;
	long ii, jj, kk, nrows = 0, nvals;
	short *differences, *rowpix, v1;
	double  *diffs, xnoise, mean, stdev;

	/* rows must have at least 3 pixels to estimate noise */
	if (nx < 3) {
		*noise = 0;
		return(*status);
	}
	
        /* allocate arrays used to compute the median and noise estimates */
	differences = calloc(nx, sizeof(short));
	if (!differences) {
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs = calloc(ny, sizeof(double));
	if (!diffs) {
		free(differences);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* loop over each row of the image */
	for (jj=0; jj < ny; jj++) {

                rowpix = array + (jj * nx); /* point to first pixel in the row */

		/***** find the first valid pixel in row */
		ii = 0;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v1 = rowpix[ii];  /* store the good pixel value */

		/* now continue populating the differences arrays */
		/* for the remaining pixels in the row */
		nvals = 0;
		for (ii++; ii < nx; ii++) {

		    /* find the next valid pixel in row */
                    if (nullcheck)
		        while (ii < nx && rowpix[ii] == nullvalue) ii++;
		     
		    if (ii == nx) break;  /* hit end of row */
		
		    /* construct array of 1st order differences */
		    differences[nvals] = v1 - rowpix[ii];

		    nvals++;  
		    /* shift over 1 pixel */
		    v1 = rowpix[ii];
	        }  /* end of loop over pixels in the row */

		if (nvals < 2)
		   continue;
		else {

		    FnMeanSigma_short(differences, nvals, 0, 0, 0, &mean, &stdev, status);

		    if (stdev > 0.) {
		        for (iter = 0;  iter < NITER;  iter++) {
		            kk = 0;
		            for (ii = 0;  ii < nvals;  ii++) {
		                if (fabs (differences[ii] - mean) < SIGMA_CLIP * stdev) {
			            if (kk < ii)
			                differences[kk] = differences[ii];
			            kk++;
		                }
		            }
		            if (kk == nvals) break;

		            nvals = kk;
		            FnMeanSigma_short(differences, nvals, 0, 0, 0, &mean, &stdev, status);
	              }
		   }

		   diffs[nrows] = stdev;
		   nrows++;
		}
	}  /* end of loop over rows */

	/* compute median of the values for each row */
	if (nrows == 0) { 
	       xnoise = 0;
	} else if (nrows == 1) {
	       xnoise = diffs[0];
	} else {
	       qsort(diffs, nrows, sizeof(double), FnCompare_double);
	       xnoise =  (diffs[(nrows - 1)/2] + diffs[nrows/2]) / 2.;
	}

	*noise = .70710678 * xnoise;

	free(diffs);
	free(differences);

	return(*status);
}